

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void sha256_update_block(void *vctx,uint8_t *inp)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint32_t T2;
  uint32_t T1;
  size_t t;
  uint32_t local_88;
  uint32_t Wt;
  uint32_t h;
  uint32_t g;
  uint32_t f;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uint32_t W [16];
  cf_sha256_context *ctx;
  uint8_t *inp_local;
  void *vctx_local;
  
  c = *vctx;
  d = *(uint32_t *)((long)vctx + 4);
  e = *(uint32_t *)((long)vctx + 8);
  f = *(uint32_t *)((long)vctx + 0xc);
  g = *(uint32_t *)((long)vctx + 0x10);
  h = *(uint32_t *)((long)vctx + 0x14);
  Wt = *(uint32_t *)((long)vctx + 0x18);
  local_88 = *(uint32_t *)((long)vctx + 0x1c);
  ctx = (cf_sha256_context *)inp;
  for (_T2 = 0; _T2 < 0x40; _T2 = _T2 + 1) {
    if (_T2 < 0x10) {
      t._4_4_ = read32_be((uint8_t *)ctx);
      (&b)[_T2] = t._4_4_;
      ctx = (cf_sha256_context *)(ctx->H + 1);
    }
    else {
      uVar4 = rotr32((&b)[_T2 - 2 & 0xf],0x11);
      uVar5 = rotr32((&b)[_T2 - 2 & 0xf],0x13);
      uVar7 = (&b)[_T2 - 2 & 0xf];
      uVar3 = (&b)[_T2 - 7 & 0xf];
      uVar1 = rotr32((&b)[_T2 - 0xf & 0xf],7);
      uVar2 = rotr32((&b)[_T2 - 0xf & 0xf],0x12);
      t._4_4_ = (uVar4 ^ uVar5 ^ uVar7 >> 10) + uVar3 + (uVar1 ^ uVar2 ^ (&b)[_T2 - 0xf & 0xf] >> 3)
                + (&b)[_T2 - 0x10 & 0xf];
      (&b)[_T2 & 0xf] = t._4_4_;
    }
    uVar3 = rotr32(g,6);
    uVar4 = rotr32(g,0xb);
    uVar5 = rotr32(g,0x19);
    iVar6 = local_88 + (uVar3 ^ uVar4 ^ uVar5) + (g & h ^ (g ^ 0xffffffff) & Wt) + K[_T2] + t._4_4_;
    uVar3 = rotr32(c,2);
    uVar4 = rotr32(c,0xd);
    uVar5 = rotr32(c,0x16);
    uVar7 = c & d;
    uVar8 = c & e;
    uVar9 = d & e;
    local_88 = Wt;
    Wt = h;
    h = g;
    g = f + iVar6;
    f = e;
    e = d;
    d = c;
    c = iVar6 + (uVar3 ^ uVar4 ^ uVar5) + (uVar7 ^ uVar8 ^ uVar9);
  }
  *(uint32_t *)vctx = c + *vctx;
  *(uint32_t *)((long)vctx + 4) = d + *(int *)((long)vctx + 4);
  *(uint32_t *)((long)vctx + 8) = e + *(int *)((long)vctx + 8);
  *(uint32_t *)((long)vctx + 0xc) = f + *(int *)((long)vctx + 0xc);
  *(uint32_t *)((long)vctx + 0x10) = g + *(int *)((long)vctx + 0x10);
  *(uint32_t *)((long)vctx + 0x14) = h + *(int *)((long)vctx + 0x14);
  *(uint32_t *)((long)vctx + 0x18) = Wt + *(int *)((long)vctx + 0x18);
  *(uint32_t *)((long)vctx + 0x1c) = local_88 + *(int *)((long)vctx + 0x1c);
  *(int *)((long)vctx + 0x60) = *(int *)((long)vctx + 0x60) + 1;
  return;
}

Assistant:

static void sha256_update_block(void *vctx, const uint8_t *inp)
{
  cf_sha256_context *ctx = vctx;

  /* This is a 16-word window into the whole W array. */
  uint32_t W[16];

  uint32_t a = ctx->H[0],
           b = ctx->H[1],
           c = ctx->H[2],
           d = ctx->H[3],
           e = ctx->H[4],
           f = ctx->H[5],
           g = ctx->H[6],
           h = ctx->H[7],
           Wt;

  for (size_t t = 0; t < 64; t++)
  {
    /* For W[0..16] we process the input into W.
     * For W[16..64] we compute the next W value:
     *
     * W[t] = SSIG1(W[t - 2]) + W[t - 7] + SSIG0(W[t - 15]) + W[t - 16];
     *
     * But all W indices are reduced mod 16 into our window.
     */
    if (t < 16)
    {
      W[t] = Wt = read32_be(inp);
      inp += 4;
    } else {
      Wt = SSIG1(W[(t - 2) % 16]) +
           W[(t - 7) % 16] +
           SSIG0(W[(t - 15) % 16]) +
           W[(t - 16) % 16];
      W[t % 16] = Wt;
    }

    uint32_t T1 = h + BSIG1(e) + CH(e, f, g) + K[t] + Wt;
    uint32_t T2 = BSIG0(a) + MAJ(a, b, c);
    h = g;
    g = f;
    f = e;
    e = d + T1;
    d = c;
    c = b;
    b = a;
    a = T1 + T2;
  }

  ctx->H[0] += a;
  ctx->H[1] += b;
  ctx->H[2] += c;
  ctx->H[3] += d;
  ctx->H[4] += e;
  ctx->H[5] += f;
  ctx->H[6] += g;
  ctx->H[7] += h;

  ctx->blocks++;
}